

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceL1LayerParams::InternalSwap
          (ReduceL1LayerParams *this,ReduceL1LayerParams *other)

{
  ReduceL1LayerParams *other_local;
  ReduceL1LayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  std::swap<bool>(&this->keepdims_,&other->keepdims_);
  std::swap<bool>(&this->reduceall_,&other->reduceall_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ReduceL1LayerParams::InternalSwap(ReduceL1LayerParams* other) {
  axes_.InternalSwap(&other->axes_);
  std::swap(keepdims_, other->keepdims_);
  std::swap(reduceall_, other->reduceall_);
  std::swap(_cached_size_, other->_cached_size_);
}